

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O1

Aig_Man_t * Aig_ManDupLevelized(Aig_Man_t *p)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  int iVar4;
  Aig_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Vec_Int_t *pVVar7;
  int *__dest;
  Aig_Obj_t **ppAVar8;
  Aig_Obj_t *pAVar9;
  Vec_Vec_t *__ptr;
  ulong uVar10;
  Vec_Ptr_t *pVVar11;
  ulong uVar12;
  Tim_Man_t *pTVar13;
  Aig_Obj_t *p1;
  long lVar14;
  long lVar15;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    iVar4 = pVVar2->nSize;
    lVar14 = (long)iVar4;
    pVVar7->nSize = iVar4;
    pVVar7->nCap = iVar4;
    if (lVar14 == 0) {
      __dest = (int *)0x0;
    }
    else {
      __dest = (int *)malloc(lVar14 * 4);
    }
    pVVar7->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,lVar14 << 2);
    p_00->vFlopNums = pVVar7;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    sVar5 = (long)p->vObjs->nSize << 3;
    ppAVar8 = (Aig_Obj_t **)malloc(sVar5);
    p_00->pEquivs = ppAVar8;
    memset(ppAVar8,0,sVar5);
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    sVar5 = (long)p->vObjs->nSize << 3;
    ppAVar8 = (Aig_Obj_t **)malloc(sVar5);
    p_00->pReprs = ppAVar8;
    memset(ppAVar8,0,sVar5);
  }
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      pvVar3 = pVVar11->pArray[lVar14];
      pAVar9 = Aig_ObjCreateCi(p_00);
      *(ulong *)&pAVar9->field_0x18 =
           *(ulong *)&pAVar9->field_0x18 & 0xff000000ffffffff |
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffff00000000;
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar9;
      lVar14 = lVar14 + 1;
      pVVar11 = p->vCis;
    } while (lVar14 < pVVar11->nSize);
  }
  __ptr = Aig_ManLevelize(p);
  if (0 < __ptr->nSize) {
    lVar14 = 0;
    do {
      if (__ptr->nSize <= lVar14) {
LAB_005fa554:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      lVar15 = 0;
      while (lVar15 < *(int *)((long)__ptr->pArray[lVar14] + 4)) {
        uVar12 = *(ulong *)(*(long *)((long)__ptr->pArray[lVar14] + 8) + lVar15 * 8);
        if ((uVar12 & 1) != 0) goto LAB_005fa535;
        uVar10 = *(ulong *)(uVar12 + 8) & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)(uVar12 + 8) & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        uVar10 = *(ulong *)(uVar12 + 0x10) & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)(uVar12 + 0x10) & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        pAVar9 = Aig_Oper(p_00,pAVar9,p1,*(Aig_Type_t *)(uVar12 + 0x18) & AIG_OBJ_VOID);
        *(Aig_Obj_t **)(uVar12 + 0x28) = pAVar9;
        lVar15 = lVar15 + 1;
        if (__ptr->nSize <= lVar14) goto LAB_005fa554;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < __ptr->nSize);
    if (0 < __ptr->nSize) {
      lVar14 = 0;
      do {
        pvVar3 = __ptr->pArray[lVar14];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
            *(undefined8 *)((long)pvVar3 + 8) = 0;
          }
          free(pvVar3);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < __ptr->nSize);
    }
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Vec_t *)0x0) {
    free(__ptr);
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      pvVar3 = pVVar11->pArray[lVar14];
      if (((ulong)pvVar3 & 1) != 0) {
LAB_005fa535:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar12 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
      if (uVar12 == 0) {
        pAVar9 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar9 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar12 + 0x28));
      }
      pAVar9 = Aig_ObjCreateCo(p_00,pAVar9);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar9;
      lVar14 = lVar14 + 1;
      pVVar11 = p->vCos;
    } while (lVar14 < pVVar11->nSize);
  }
  if ((p->nObjs[4] == 0) && (p->nObjs[6] + p->nObjs[5] != p_00->nObjs[6] + p_00->nObjs[5])) {
    __assert_fail("Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                  ,0x32b,"Aig_Man_t *Aig_ManDupLevelized(Aig_Man_t *)");
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pTVar13 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar13;
  }
  iVar4 = Aig_ManCheck(p_00);
  if (iVar4 == 0) {
    puts("Aig_ManDupLevelized(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupLevelized( Aig_Man_t * p )
{
    Vec_Vec_t * vLevels;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i, k;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // duplicate representation of choice nodes
    if ( p->pEquivs )
    {
        pNew->pEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pEquivs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    if ( p->pReprs )
    {
        pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    // create the PIs
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi( pNew );
        pObjNew->Level = pObj->Level;
        pObj->pData = pObjNew;
    }
    // duplicate internal nodes
    vLevels = Aig_ManLevelize( p );
    Vec_VecForEachEntry( Aig_Obj_t *, vLevels, pObj, i, k )
    {
        pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        pObj->pData = pObjNew;
    }
    Vec_VecFree( vLevels );
    // duplicate POs
    Aig_ManForEachCo( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        pObj->pData = pObjNew;
    }
    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
//    if ( (nNodes = Aig_ManCleanup( pNew )) )
//        printf( "Aig_ManDupLevelized(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupLevelized(): The check has failed.\n" );
    return pNew;
}